

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

bool wasm::hasActiveSegments(Module *wasm)

{
  pointer puVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  puVar1 = (wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  bVar6 = lVar2 != 0;
  if ((bVar6) &&
     (*(char *)((long)(puVar1->_M_t).
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t + 0x28) == '\x01')) {
    uVar3 = lVar2 >> 3;
    uVar4 = 1;
    do {
      uVar5 = (ulong)uVar4;
      bVar6 = uVar5 < uVar3;
      if (uVar3 <= uVar5) {
        return bVar6;
      }
      uVar4 = uVar4 + 1;
    } while (*(char *)((long)puVar1[uVar5]._M_t.
                             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                             ._M_t + 0x28) != '\0');
  }
  return bVar6;
}

Assistant:

bool hasActiveSegments(Module& wasm) {
  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    if (!wasm.dataSegments[i]->isPassive) {
      return true;
    }
  }
  return false;
}